

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O0

void InitSystemAllocators(void)

{
  MmapSysAllocator *alloc;
  SysAllocator *alloc_00;
  DefaultSysAllocator *this;
  bool want_mmap;
  DefaultSysAllocator *sdef;
  SbrkSysAllocator *sbrk;
  MmapSysAllocator *mmap;
  
  alloc = tcmalloc::StaticStorage<MmapSysAllocator>::Construct<>(&mmap_space);
  alloc_00 = &tcmalloc::StaticStorage<SbrkSysAllocator>::Construct<>(&sbrk_space)->
              super_SysAllocator;
  this = tcmalloc::StaticStorage<DefaultSysAllocator>::Construct<>(&default_space);
  DefaultSysAllocator::SetChildAllocator(this,alloc_00,0,"SbrkSysAllocator");
  DefaultSysAllocator::SetChildAllocator(this,&alloc->super_SysAllocator,1,"MmapSysAllocator");
  tcmalloc_sys_alloc = tc_get_sysalloc_override(&this->super_SysAllocator);
  return;
}

Assistant:

void InitSystemAllocators(void) {
  MmapSysAllocator *mmap = mmap_space.Construct();
  SbrkSysAllocator *sbrk = sbrk_space.Construct();

  // In 64-bit debug mode, place the mmap allocator first since it
  // allocates pointers that do not fit in 32 bits and therefore gives
  // us better testing of code's 64-bit correctness.  It also leads to
  // less false negatives in heap-checking code.  (Numbers are less
  // likely to look like pointers and therefore the conservative gc in
  // the heap-checker is less likely to misinterpret a number as a
  // pointer).
  DefaultSysAllocator *sdef = default_space.Construct();
  bool want_mmap = kDebugMode && (sizeof(void*) > 4);
  if (want_mmap) {
    sdef->SetChildAllocator(mmap, 0, mmap_name);
    sdef->SetChildAllocator(sbrk, 1, sbrk_name);
  } else {
    sdef->SetChildAllocator(sbrk, 0, sbrk_name);
    sdef->SetChildAllocator(mmap, 1, mmap_name);
  }

  tcmalloc_sys_alloc = tc_get_sysalloc_override(sdef);
}